

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

void __thiscall
glcts::LayoutBindingBaseCase::LayoutBindingBaseCase
          (LayoutBindingBaseCase *this,Context *context,char *name,char *description,StageType stage
          ,LayoutBindingParameters *samplerType,GLSLVersion glslVersion)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  eSurfaceType eVar6;
  eTextureType eVar7;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SamplerLayoutBindingCase_020fcda0;
  (this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier =
       (_func_int **)&PTR__LayoutBindingBaseCase_020fcef8;
  this->m_drawTest = 0;
  *(undefined8 *)&this->field_0x88 = 0;
  (this->m_tests).
  super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tests).
  super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tests).
  super__Vector_base<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  eVar6 = samplerType->surface_type;
  eVar7 = samplerType->texture_type;
  pcVar2 = samplerType->vector_type;
  pcVar3 = samplerType->uniform_type;
  pcVar4 = samplerType->coord_vector_type;
  pcVar5 = samplerType->access_function;
  (this->m_testParams).keyword = samplerType->keyword;
  (this->m_testParams).surface_type = eVar6;
  (this->m_testParams).texture_type = eVar7;
  (this->m_testParams).vector_type = pcVar2;
  (this->m_testParams).uniform_type = pcVar3;
  (this->m_testParams).coord_vector_type = pcVar4;
  (this->m_testParams).access_function = pcVar5;
  (this->m_stage).name = stage.name;
  (this->m_stage).type = stage.type;
  p_Var1 = &(this->m_sources)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sources)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sources)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_sources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_sources)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_sources)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_templateParams)._M_t._M_impl.super__Rb_tree_header;
  (this->m_templateParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_templateParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_templateParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_templateParams)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_templateParams)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_templates)._M_t._M_impl.super__Rb_tree_header;
  (this->m_templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_templates)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_textures2D)._M_t._M_impl.super__Rb_tree_header;
  (this->m_textures2D)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_textures2D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_textures2D)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_textures2D)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_textures2D)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_textures2DArray)._M_t._M_impl.super__Rb_tree_header;
  (this->m_textures2DArray)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_textures2DArray)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_textures2DArray)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_textures2DArray)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_textures2DArray)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_textures3D)._M_t._M_impl.super__Rb_tree_header;
  (this->m_textures3D)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_textures3D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_textures3D)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_textures3D)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_expectedColor).m_data[2] = 0.0;
  (this->m_expectedColor).m_data[3] = 0.0;
  this->m_uniformDeclTemplate = (char *)0x0;
  (this->m_textures3D)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_expectedColor).m_data[0] = 0.0;
  (this->m_expectedColor).m_data[1] = 0.0;
  this->m_glslVersion = glslVersion;
  return;
}

Assistant:

LayoutBindingBaseCase::LayoutBindingBaseCase(Context& context, const char* name, const char* description,
											 StageType stage, LayoutBindingParameters& samplerType,
											 glu::GLSLVersion glslVersion)
	: TestCase(context, name, description)
	, m_drawTest(DE_NULL)
	, m_testParams(samplerType)
	, m_stage(stage)
	, m_uniformDeclTemplate(DE_NULL)
	, m_glslVersion(glslVersion)
{
}